

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarantool_poll.c
# Opt level: O1

int main(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  tnt_stream *ptVar4;
  tnt_reply *r;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  undefined8 local_40d8 [2048];
  char acStack_d8 [8];
  char uri [128];
  undefined8 local_50;
  undefined8 local_48;
  undefined1 *local_40;
  int local_34;
  
  local_34 = 1;
  plan(1);
  plan(1);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_poll");
  fputc(10,_stdout);
  uri[0x68] = '\0';
  uri[0x69] = '\0';
  uri[0x6a] = '\0';
  uri[0x6b] = '\0';
  uri[0x6c] = '\0';
  uri[0x6d] = '\0';
  uri[0x6e] = '\0';
  uri[0x6f] = '\0';
  uri[0x70] = '\0';
  uri[0x71] = '\0';
  uri[0x72] = '\0';
  uri[0x73] = '\0';
  uri[0x74] = '\0';
  uri[0x75] = '\0';
  uri[0x76] = '\0';
  uri[0x77] = '\0';
  uri[0x58] = '\0';
  uri[0x59] = '\0';
  uri[0x5a] = '\0';
  uri[0x5b] = '\0';
  uri[0x5c] = '\0';
  uri[0x5d] = '\0';
  uri[0x5e] = '\0';
  uri[0x5f] = '\0';
  uri[0x60] = '\0';
  uri[0x61] = '\0';
  uri[0x62] = '\0';
  uri[99] = '\0';
  uri[100] = '\0';
  uri[0x65] = '\0';
  uri[0x66] = '\0';
  uri[0x67] = '\0';
  uri[0x48] = '\0';
  uri[0x49] = '\0';
  uri[0x4a] = '\0';
  uri[0x4b] = '\0';
  uri[0x4c] = '\0';
  uri[0x4d] = '\0';
  uri[0x4e] = '\0';
  uri[0x4f] = '\0';
  uri[0x50] = '\0';
  uri[0x51] = '\0';
  uri[0x52] = '\0';
  uri[0x53] = '\0';
  uri[0x54] = '\0';
  uri[0x55] = '\0';
  uri[0x56] = '\0';
  uri[0x57] = '\0';
  uri[0x38] = '\0';
  uri[0x39] = '\0';
  uri[0x3a] = '\0';
  uri[0x3b] = '\0';
  uri[0x3c] = '\0';
  uri[0x3d] = '\0';
  uri[0x3e] = '\0';
  uri[0x3f] = '\0';
  uri[0x40] = '\0';
  uri[0x41] = '\0';
  uri[0x42] = '\0';
  uri[0x43] = '\0';
  uri[0x44] = '\0';
  uri[0x45] = '\0';
  uri[0x46] = '\0';
  uri[0x47] = '\0';
  uri[0x28] = '\0';
  uri[0x29] = '\0';
  uri[0x2a] = '\0';
  uri[0x2b] = '\0';
  uri[0x2c] = '\0';
  uri[0x2d] = '\0';
  uri[0x2e] = '\0';
  uri[0x2f] = '\0';
  uri[0x30] = '\0';
  uri[0x31] = '\0';
  uri[0x32] = '\0';
  uri[0x33] = '\0';
  uri[0x34] = '\0';
  uri[0x35] = '\0';
  uri[0x36] = '\0';
  uri[0x37] = '\0';
  uri[0x18] = '\0';
  uri[0x19] = '\0';
  uri[0x1a] = '\0';
  uri[0x1b] = '\0';
  uri[0x1c] = '\0';
  uri[0x1d] = '\0';
  uri[0x1e] = '\0';
  uri[0x1f] = '\0';
  uri[0x20] = '\0';
  uri[0x21] = '\0';
  uri[0x22] = '\0';
  uri[0x23] = '\0';
  uri[0x24] = '\0';
  uri[0x25] = '\0';
  uri[0x26] = '\0';
  uri[0x27] = '\0';
  uri[8] = '\0';
  uri[9] = '\0';
  uri[10] = '\0';
  uri[0xb] = '\0';
  uri[0xc] = '\0';
  uri[0xd] = '\0';
  uri[0xe] = '\0';
  uri[0xf] = '\0';
  uri[0x10] = '\0';
  uri[0x11] = '\0';
  uri[0x12] = '\0';
  uri[0x13] = '\0';
  uri[0x14] = '\0';
  uri[0x15] = '\0';
  uri[0x16] = '\0';
  uri[0x17] = '\0';
  acStack_d8[0] = '\0';
  acStack_d8[1] = '\0';
  acStack_d8[2] = '\0';
  acStack_d8[3] = '\0';
  acStack_d8[4] = '\0';
  acStack_d8[5] = '\0';
  acStack_d8[6] = '\0';
  acStack_d8[7] = '\0';
  uri[0] = '\0';
  uri[1] = '\0';
  uri[2] = '\0';
  uri[3] = '\0';
  uri[4] = '\0';
  uri[5] = '\0';
  uri[6] = '\0';
  uri[7] = '\0';
  pcVar3 = getenv("LISTEN");
  snprintf(acStack_d8,0x80,"test:test@%s",pcVar3);
  local_40 = (undefined1 *)local_40d8;
  memset(local_40d8,0,0x4000);
  uVar5 = 0xffffffff;
  uVar6 = 0;
  do {
    ptVar4 = tnt_net((tnt_stream *)0x0);
    if (ptVar4 == (tnt_stream *)0x0) {
      __assert_fail("tnt != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_poll.c"
                    ,0x26,"int test_poll()");
    }
    iVar2 = tnt_set(ptVar4,0,acStack_d8);
    if (iVar2 == 0) {
      iVar2 = tnt_set(ptVar4,7,0);
      if (iVar2 != 0) {
        main_cold_2();
        goto LAB_00104f17;
      }
      iVar2 = tnt_set(ptVar4,10,0);
      if (iVar2 != 0) {
        main_cold_3();
        goto LAB_00104f17;
      }
      local_50 = 10;
      local_48 = 0;
      iVar2 = tnt_set(ptVar4,1,&local_50);
      if (iVar2 != 0) {
        main_cold_4();
        goto LAB_00104f17;
      }
      iVar2 = tnt_connect(ptVar4);
      if (iVar2 != 0) {
        main_cold_5();
        goto LAB_00104f17;
      }
      local_40d8[uVar6] = ptVar4;
      tnt_ping(ptVar4);
      tnt_flush(ptVar4);
      r = tnt_reply_init((tnt_reply *)0x0);
      iVar2 = (*ptVar4->read_reply)(ptVar4,r);
      if (iVar2 == 0) {
        tnt_reply_free(r);
        iVar2 = 0;
      }
      else {
        main_cold_6();
        local_34 = 0;
        iVar2 = 5;
      }
      uVar5 = uVar6 & 0xffffffff;
    }
    else {
      main_cold_1();
LAB_00104f17:
      local_34 = 0;
      iVar2 = 5;
    }
    if (iVar2 != 0) goto LAB_00104f51;
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x800);
  iVar2 = 2;
LAB_00104f51:
  if ((iVar2 == 5) || (iVar2 == 2)) {
    iVar2 = __ok((uint)(local_34 == 1),"expected non-assert test");
    if (iVar2 == 0) {
      main_cold_7();
    }
    if (-1 < (int)uVar5) {
      lVar7 = uVar5 + 1;
      do {
        ptVar4 = (tnt_stream *)local_40d8[lVar7 + -1];
        if (ptVar4 != (tnt_stream *)0x0) {
          tnt_close(ptVar4);
          tnt_stream_free(ptVar4);
        }
        lVar8 = lVar7 + -1;
        bVar1 = 0 < lVar7;
        lVar7 = lVar8;
      } while (lVar8 != 0 && bVar1);
    }
    check_plan();
  }
  return 0;
}

Assistant:

int main()
{
	plan(1);

	test_poll();

	return 0;
}